

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::StochasticTask::StochasticTask
          (StochasticTask *this,KnownSystemName knownNameId,SubroutineKind subroutineKind,
          size_t inputArgs,size_t outputArgs)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00cd12c8;
  sVar1 = parsing::toString(knownNameId);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = subroutineKind;
  (this->super_SystemSubroutine).knownNameId = knownNameId;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00cd1100;
  this->inputArgs = inputArgs;
  this->outputArgs = outputArgs;
  (this->super_SystemSubroutine).hasOutputArgs = outputArgs != 0;
  return;
}

Assistant:

StochasticTask(KnownSystemName knownNameId, SubroutineKind subroutineKind, size_t inputArgs,
                   size_t outputArgs) :
        SystemSubroutine(knownNameId, subroutineKind), inputArgs(inputArgs),
        outputArgs(outputArgs) {
        hasOutputArgs = outputArgs > 0;
    }